

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filter.cpp
# Opt level: O2

void __thiscall nv::Kernel2::initBlendedSobel(Kernel2 *this,Vector4 *scale)

{
  int iVar1;
  float *pfVar2;
  long lVar3;
  float *pfVar4;
  undefined8 *puVar5;
  int i_2;
  undefined4 *puVar6;
  long lVar7;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined4 local_28;
  undefined4 uStack_24;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  undefined4 local_18;
  
  puVar5 = &local_38;
  if (this->m_windowSize != 9) {
    iVar1 = nvAbort("m_windowSize == 9",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/3rd party/nvtt/nvimage/Filter.cpp"
                    ,0x1da,"void nv::Kernel2::initBlendedSobel(const Vector4 &)");
    if (iVar1 == 1) {
      raise(5);
    }
  }
  pfVar2 = this->m_data;
  for (lVar3 = 0; lVar3 != 0x144; lVar3 = lVar3 + 4) {
    *(float *)((long)pfVar2 + lVar3) = *(float *)((long)&DAT_001d7920 + lVar3) * scale->m_w;
  }
  pfVar4 = pfVar2 + 10;
  puVar6 = &DAT_001d7a70;
  for (lVar3 = 0; lVar3 != 7; lVar3 = lVar3 + 1) {
    for (lVar7 = 0; lVar7 != 7; lVar7 = lVar7 + 1) {
      pfVar4[lVar7] = (float)puVar6[lVar7] * scale->m_z + pfVar4[lVar7];
    }
    pfVar4 = pfVar4 + 9;
    puVar6 = puVar6 + 7;
  }
  pfVar4 = pfVar2 + 0x14;
  puVar6 = &DAT_001d7b40;
  for (lVar3 = 0; lVar3 != 5; lVar3 = lVar3 + 1) {
    for (lVar7 = 0; lVar7 != 5; lVar7 = lVar7 + 1) {
      pfVar4[lVar7] = (float)puVar6[lVar7] * scale->m_y + pfVar4[lVar7];
    }
    pfVar4 = pfVar4 + 9;
    puVar6 = puVar6 + 5;
  }
  local_28 = 0;
  uStack_1c = 0;
  local_38 = 0xbf800000;
  uStack_30 = 0xc00000003f800000;
  uStack_24 = 0x40000000;
  uStack_20 = 0xbf800000;
  local_18 = 0x3f800000;
  pfVar2 = pfVar2 + 0x1e;
  for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
    for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
      pfVar2[lVar7] = *(float *)((long)puVar5 + lVar7 * 4) * scale->m_x + pfVar2[lVar7];
    }
    pfVar2 = pfVar2 + 9;
    puVar5 = (undefined8 *)((long)puVar5 + 0xc);
  }
  return;
}

Assistant:

void Kernel2::initBlendedSobel(const Vector4 & scale)
{
	nvCheck(m_windowSize == 9);

	{
		const float elements[] = {
            -1, -2, -3, -4, 0, 4, 3, 2, 1,
            -2, -3, -4, -5, 0, 5, 4, 3, 2,
            -3, -4, -5, -6, 0, 6, 5, 4, 3,
            -4, -5, -6, -7, 0, 7, 6, 5, 4,
            -5, -6, -7, -8, 0, 8, 7, 6, 5,
            -4, -5, -6, -7, 0, 7, 6, 5, 4,
            -3, -4, -5, -6, 0, 6, 5, 4, 3,
            -2, -3, -4, -5, 0, 5, 4, 3, 2,
            -1, -2, -3, -4, 0, 4, 3, 2, 1
		};
		
		for (int i = 0; i < 9*9; i++) {
			m_data[i] = elements[i] * scale.w();
		}
	}
	{
		const float elements[] = {
            -1, -2, -3, 0, 3, 2, 1,
            -2, -3, -4, 0, 4, 3, 2,
            -3, -4, -5, 0, 5, 4, 3,
            -4, -5, -6, 0, 6, 5, 4,
            -3, -4, -5, 0, 5, 4, 3,
            -2, -3, -4, 0, 4, 3, 2,
            -1, -2, -3, 0, 3, 2, 1,
		};

		for (int i = 0; i < 7; i++) {
			for (int e = 0; e < 7; e++) {
				m_data[(i + 1) * 9 + e + 1] += elements[i * 7 + e] * scale.z();
			}
		}
	}
	{
		const float elements[] = {
            -1, -2, 0, 2, 1,
            -2, -3, 0, 3, 2,
            -3, -4, 0, 4, 3,
            -2, -3, 0, 3, 2,
            -1, -2, 0, 2, 1
		};

		for (int i = 0; i < 5; i++) {
			for (int e = 0; e < 5; e++) {
				m_data[(i + 2) * 9 + e + 2] += elements[i * 5 + e] * scale.y();
			}
		}
	}
	{
		const float elements[] = {
            -1, 0, 1,
            -2, 0, 2,
            -1, 0, 1,
		};

		for (int i = 0; i < 3; i++) {
			for (int e = 0; e < 3; e++) {
				m_data[(i + 3) * 9 + e + 3] += elements[i * 3 + e] * scale.x();
			}
		}
	}
}